

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

char * INT_create_multityped_action_spec(FMStructDescList *input_format_lists,char *function)

{
  long lVar1;
  FMStructDescRec *f;
  FMStructDescRec *__s;
  size_t sVar2;
  char *__s_00;
  char *in_RSI;
  long in_RDI;
  bool bVar3;
  FMStructDescList format_list;
  int format_count;
  char *str;
  int i;
  int l;
  int list_count;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  uint local_2c;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar5;
  int local_18;
  uint local_14;
  
  local_14 = 0;
  while( true ) {
    bVar3 = false;
    if (in_RDI != 0) {
      bVar3 = *(long *)(in_RDI + (long)(int)local_14 * 8) != 0;
    }
    if (!bVar3) break;
    local_14 = local_14 + 1;
  }
  f = (FMStructDescRec *)INT_CMmalloc((size_t)in_stack_ffffffffffffffa0);
  sprintf((char *)f,"Multityped Action   List Count %d\n",(ulong)local_14);
  for (local_18 = 0; local_18 < (int)local_14; local_18 = local_18 + 1) {
    local_2c = 0;
    lVar1 = *(long *)(in_RDI + (long)local_18 * 8);
    while( true ) {
      bVar3 = false;
      if (lVar1 != 0) {
        bVar3 = *(long *)(lVar1 + (long)(int)local_2c * 0x20) != 0;
      }
      if (!bVar3) break;
      local_2c = local_2c + 1;
    }
    strlen((char *)f);
    __s = (FMStructDescRec *)INT_CMrealloc(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    f = __s;
    sVar2 = strlen((char *)__s);
    sprintf((char *)((long)&__s->format_name + sVar2),"Next format   Subformat Count %d\n",
            (ulong)local_2c);
    for (iVar5 = 0; iVar5 < (int)local_2c; iVar5 = iVar5 + 1) {
      f = (FMStructDescRec *)
          add_FMfieldlist_to_string((char *)CONCAT44(iVar5,in_stack_ffffffffffffffe0),f);
    }
  }
  sVar2 = strlen((char *)f);
  strlen(in_RSI);
  __s_00 = (char *)INT_CMrealloc(f,sVar2);
  pcVar4 = __s_00;
  sVar2 = strlen(__s_00);
  strcpy(__s_00 + sVar2,in_RSI);
  return pcVar4;
}

Assistant:

extern char *
INT_create_multityped_action_spec(FMStructDescList *input_format_lists, char *function)
{
    int list_count = 0;
    int l, i;
    char *str;
    while(input_format_lists && input_format_lists[list_count] != NULL)
	list_count++;

    str = malloc(50);
    sprintf(str, "Multityped Action   List Count %d\n", list_count);

    for (l = 0; l < list_count; l++) {
	int format_count = 0;
	FMStructDescList format_list = input_format_lists[l];
	while(format_list && format_list[format_count].format_name != NULL)
	    format_count++;
	str = realloc(str, strlen(str) + 50);
	sprintf(str + strlen(str), "Next format   Subformat Count %d\n",
		format_count);
	for (i = 0 ; i < format_count; i++) {
	    str = add_FMfieldlist_to_string(str, &format_list[i]);
	}
    }

    str = realloc(str, strlen(str) + strlen(function) + 1);
    strcpy(&str[strlen(str)], function);
    return str;
}